

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,size_t i)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined4 uVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined4 uVar67;
  undefined4 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar2 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  lVar22 = sVar5 * uVar2;
  auVar59 = *(undefined1 (*) [16])(pcVar4 + lVar22);
  lVar19 = sVar5 * (uVar2 + 1);
  auVar28 = *(undefined1 (*) [16])(pcVar4 + lVar19);
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar6 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  lVar20 = uVar2 * sVar5;
  lVar21 = sVar5 * (uVar2 + 1);
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar15 = fVar1 * *(float *)(pcVar4 + lVar22 + 0xc);
  auVar29 = vinsertps_avx(auVar59,ZEXT416((uint)fVar15),0x30);
  fVar16 = fVar1 * *(float *)(pcVar4 + lVar19 + 0xc);
  auVar58 = vinsertps_avx(auVar28,ZEXT416((uint)fVar16),0x30);
  auVar32 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar20),
                          ZEXT416((uint)(fVar1 * *(float *)(pcVar6 + lVar20 + 0xc))),0x30);
  auVar65 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar21),
                          ZEXT416((uint)(fVar1 * *(float *)(pcVar6 + lVar21 + 0xc))),0x30);
  auVar30._8_4_ = 0xbeaaaaab;
  auVar30._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar30._12_4_ = 0xbeaaaaab;
  auVar32 = vfnmadd213ps_fma(auVar32,auVar30,auVar29);
  auVar29 = vfmadd213ps_fma(auVar65,auVar30,auVar58);
  lVar19 = (long)(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tessellationRate;
  uVar60 = auVar59._0_4_;
  uVar68 = auVar32._0_4_;
  uVar67 = auVar29._0_4_;
  if (lVar19 == 4) {
    auVar64._4_4_ = uVar60;
    auVar64._0_4_ = uVar60;
    auVar64._8_4_ = uVar60;
    auVar64._12_4_ = uVar60;
    auVar65 = vshufps_avx(auVar59,auVar59,0x55);
    auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
    auVar69._4_4_ = fVar15;
    auVar69._0_4_ = fVar15;
    auVar69._8_4_ = fVar15;
    auVar69._12_4_ = fVar15;
    auVar71._4_4_ = uVar68;
    auVar71._0_4_ = uVar68;
    auVar71._8_4_ = uVar68;
    auVar71._12_4_ = uVar68;
    auVar30 = vshufps_avx(auVar32,auVar32,0x55);
    auVar31 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar32 = vshufps_avx(auVar32,auVar32,0xff);
    auVar73._4_4_ = uVar67;
    auVar73._0_4_ = uVar67;
    auVar73._8_4_ = uVar67;
    auVar73._12_4_ = uVar67;
    auVar23 = vshufps_avx512vl(auVar29,auVar29,0x55);
    auVar24 = vshufps_avx512vl(auVar29,auVar29,0xaa);
    auVar29 = vshufps_avx(auVar29,auVar29,0xff);
    auVar25 = vbroadcastss_avx512vl(auVar28);
    auVar26 = vshufps_avx512vl(auVar28,auVar28,0x55);
    auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
    auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)fVar16));
    auVar25 = vmulps_avx512vl(auVar25,bezier_basis0._3740_16_);
    auVar26 = vmulps_avx512vl(auVar26,bezier_basis0._3740_16_);
    auVar28 = vmulps_avx512vl(auVar28,bezier_basis0._3740_16_);
    auVar27 = vmulps_avx512vl(auVar27,bezier_basis0._3740_16_);
    auVar25 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._2584_16_,auVar73);
    auVar23 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._2584_16_,auVar23);
    auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._2584_16_,auVar24);
    auVar29 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._2584_16_,auVar29);
    auVar24 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._1428_16_,auVar71);
    auVar30 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._1428_16_,auVar30);
    auVar28 = vfmadd231ps_fma(auVar28,bezier_basis0._1428_16_,auVar31);
    auVar29 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._1428_16_,auVar32);
    auVar31 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._272_16_,auVar64);
    auVar30 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._272_16_,auVar65);
    auVar65 = vfmadd231ps_fma(auVar28,bezier_basis0._272_16_,auVar59);
    auVar23 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._272_16_,auVar69);
    auVar24 = vshufps_avx512vl(auVar31,auVar31,0xb1);
    auVar28 = vminps_avx512vl(auVar24,auVar31);
    auVar59 = vshufpd_avx(auVar28,auVar28,1);
    auVar59 = vminps_avx(auVar59,auVar28);
    auVar25 = vshufps_avx512vl(auVar30,auVar30,0xb1);
    auVar29 = vminps_avx512vl(auVar25,auVar30);
    auVar28 = vshufpd_avx(auVar29,auVar29,1);
    auVar28 = vminps_avx(auVar28,auVar29);
    auVar59 = vinsertps_avx(auVar59,auVar28,0x1c);
    auVar32 = vshufps_avx(auVar65,auVar65,0xb1);
    auVar28 = vminps_avx(auVar32,auVar65);
    auVar29 = vshufpd_avx(auVar28,auVar28,1);
    auVar28 = vminps_avx(auVar29,auVar28);
    auVar59 = vinsertps_avx(auVar59,auVar28,0x20);
    auVar29 = vmaxps_avx512vl(auVar24,auVar31);
    auVar28 = vshufpd_avx(auVar29,auVar29,1);
    auVar28 = vmaxps_avx(auVar28,auVar29);
    auVar30 = vmaxps_avx512vl(auVar25,auVar30);
    auVar29 = vshufpd_avx(auVar30,auVar30,1);
    auVar29 = vmaxps_avx(auVar29,auVar30);
    auVar28 = vinsertps_avx(auVar28,auVar29,0x1c);
    auVar29 = vmaxps_avx(auVar32,auVar65);
    auVar32 = vshufpd_avx(auVar29,auVar29,1);
    auVar29 = vmaxps_avx(auVar32,auVar29);
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl(auVar23,auVar32);
    auVar28 = vinsertps_avx(auVar28,auVar29,0x20);
    auVar29 = vprolq_avx512vl(auVar32,0x20);
    auVar29 = vmaxps_avx(auVar29,auVar32);
    uVar60 = auVar29._0_4_;
    auVar65._4_4_ = uVar60;
    auVar65._0_4_ = uVar60;
    auVar65._8_4_ = uVar60;
    auVar65._12_4_ = uVar60;
    auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
    auVar29 = vmaxps_avx(auVar29,auVar65);
  }
  else {
    auVar33 = vpbroadcastd_avx512vl();
    auVar66._4_4_ = uVar60;
    auVar66._0_4_ = uVar60;
    auVar66._8_4_ = uVar60;
    auVar66._12_4_ = uVar60;
    auVar66._16_4_ = uVar60;
    auVar66._20_4_ = uVar60;
    auVar66._24_4_ = uVar60;
    auVar66._28_4_ = uVar60;
    auVar34 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar35 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar36 = vpermps_avx512vl(auVar34,ZEXT1632(auVar59));
    auVar37 = vpermps_avx512vl(auVar35,ZEXT1632(auVar59));
    auVar70._4_4_ = fVar15;
    auVar70._0_4_ = fVar15;
    auVar70._8_4_ = fVar15;
    auVar70._12_4_ = fVar15;
    auVar70._16_4_ = fVar15;
    auVar70._20_4_ = fVar15;
    auVar70._24_4_ = fVar15;
    auVar70._28_4_ = fVar15;
    auVar72._4_4_ = uVar68;
    auVar72._0_4_ = uVar68;
    auVar72._8_4_ = uVar68;
    auVar72._12_4_ = uVar68;
    auVar72._16_4_ = uVar68;
    auVar72._20_4_ = uVar68;
    auVar72._24_4_ = uVar68;
    auVar72._28_4_ = uVar68;
    auVar55 = ZEXT1632(auVar32);
    auVar38 = vpermps_avx512vl(auVar34,auVar55);
    auVar39 = vpermps_avx512vl(auVar35,auVar55);
    auVar63._8_4_ = 3;
    auVar63._0_8_ = 0x300000003;
    auVar63._12_4_ = 3;
    auVar63._16_4_ = 3;
    auVar63._20_4_ = 3;
    auVar63._24_4_ = 3;
    auVar63._28_4_ = 3;
    auVar55 = vpermps_avx2(auVar63,auVar55);
    auVar74._4_4_ = uVar67;
    auVar74._0_4_ = uVar67;
    auVar74._8_4_ = uVar67;
    auVar74._12_4_ = uVar67;
    auVar74._16_4_ = uVar67;
    auVar74._20_4_ = uVar67;
    auVar74._24_4_ = uVar67;
    auVar74._28_4_ = uVar67;
    auVar57 = ZEXT1632(auVar29);
    auVar40 = vpermps_avx512vl(auVar34,auVar57);
    auVar41 = vpermps_avx512vl(auVar35,auVar57);
    auVar42 = vpermps_avx512vl(auVar63,auVar57);
    auVar43 = vbroadcastss_avx512vl(auVar28);
    auVar44 = vpermps_avx512vl(auVar34,ZEXT1632(auVar28));
    auVar45 = vpermps_avx512vl(auVar35,ZEXT1632(auVar28));
    auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)fVar16));
    lVar20 = lVar19 * 0x44;
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar34._8_4_ = 0xff800000;
    auVar34._0_8_ = 0xff800000ff800000;
    auVar34._12_4_ = 0xff800000;
    auVar34._16_4_ = 0xff800000;
    auVar34._20_4_ = 0xff800000;
    auVar34._24_4_ = 0xff800000;
    auVar34._28_4_ = 0xff800000;
    auVar62 = ZEXT864(0) << 0x20;
    lVar21 = 0;
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar35 = auVar34;
    auVar63 = auVar34;
    auVar56 = auVar47;
    auVar57 = auVar47;
    for (; auVar61 = auVar62._0_32_, lVar21 < lVar19; lVar21 = lVar21 + 8) {
      auVar49 = vpbroadcastd_avx512vl();
      auVar50 = vpord_avx512vl(auVar49,_DAT_01fb4ba0);
      auVar49 = *(undefined1 (*) [32])(lVar20 + 0x21fbbec + lVar21 * 4);
      auVar53 = *(undefined1 (*) [32])(lVar20 + 0x21fc070 + lVar21 * 4);
      uVar18 = vpcmpgtd_avx512vl(auVar33,auVar50);
      auVar50 = vmulps_avx512vl(auVar43,auVar53);
      auVar51 = vmulps_avx512vl(auVar44,auVar53);
      auVar52 = vmulps_avx512vl(auVar45,auVar53);
      auVar53 = vmulps_avx512vl(auVar46,auVar53);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar49,auVar74);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar40);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar41);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar42,auVar49);
      auVar49 = *(undefined1 (*) [32])(lVar20 + 0x21fb768 + lVar21 * 4);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar49,auVar72);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar38);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar39);
      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar55,auVar49);
      auVar49 = *(undefined1 (*) [32])(bezier_basis0 + lVar21 * 4 + lVar20);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar49,auVar66);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar36);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar37);
      auVar49 = vfmadd231ps_avx512vl(auVar53,auVar70,auVar49);
      auVar54 = vminps_avx512vl(auVar56,auVar50);
      bVar7 = (byte)uVar18;
      auVar53._0_4_ = (uint)(bVar7 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar56._0_4_;
      bVar8 = (bool)((byte)(uVar18 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar8 * auVar54._4_4_ | (uint)!bVar8 * auVar56._4_4_;
      bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar8 * auVar54._8_4_ | (uint)!bVar8 * auVar56._8_4_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar53._12_4_ = (uint)bVar8 * auVar54._12_4_ | (uint)!bVar8 * auVar56._12_4_;
      bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
      auVar53._16_4_ = (uint)bVar8 * auVar54._16_4_ | (uint)!bVar8 * auVar56._16_4_;
      bVar8 = (bool)((byte)(uVar18 >> 5) & 1);
      auVar53._20_4_ = (uint)bVar8 * auVar54._20_4_ | (uint)!bVar8 * auVar56._20_4_;
      bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
      auVar53._24_4_ = (uint)bVar8 * auVar54._24_4_ | (uint)!bVar8 * auVar56._24_4_;
      bVar8 = SUB81(uVar18 >> 7,0);
      auVar53._28_4_ = (uint)bVar8 * auVar54._28_4_ | (uint)!bVar8 * auVar56._28_4_;
      auVar50 = vmaxps_avx512vl(auVar35,auVar50);
      auVar56._0_4_ = (uint)(bVar7 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar35._0_4_;
      bVar8 = (bool)((byte)(uVar18 >> 1) & 1);
      auVar56._4_4_ = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar35._4_4_;
      bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
      auVar56._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * auVar35._8_4_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar56._12_4_ = (uint)bVar8 * auVar50._12_4_ | (uint)!bVar8 * auVar35._12_4_;
      bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
      auVar56._16_4_ = (uint)bVar8 * auVar50._16_4_ | (uint)!bVar8 * auVar35._16_4_;
      bVar8 = (bool)((byte)(uVar18 >> 5) & 1);
      auVar56._20_4_ = (uint)bVar8 * auVar50._20_4_ | (uint)!bVar8 * auVar35._20_4_;
      bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
      auVar56._24_4_ = (uint)bVar8 * auVar50._24_4_ | (uint)!bVar8 * auVar35._24_4_;
      bVar8 = SUB81(uVar18 >> 7,0);
      auVar56._28_4_ = (uint)bVar8 * auVar50._28_4_ | (uint)!bVar8 * auVar35._28_4_;
      auVar35 = vminps_avx512vl(auVar57,auVar51);
      auVar50._0_4_ = (uint)(bVar7 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar57._0_4_;
      bVar8 = (bool)((byte)(uVar18 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar57._4_4_;
      bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar57._8_4_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar57._12_4_;
      bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar8 * auVar35._16_4_ | (uint)!bVar8 * auVar57._16_4_;
      bVar8 = (bool)((byte)(uVar18 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * auVar57._20_4_;
      bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar8 * auVar35._24_4_ | (uint)!bVar8 * auVar57._24_4_;
      bVar8 = SUB81(uVar18 >> 7,0);
      auVar50._28_4_ = (uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar57._28_4_;
      auVar35 = vmaxps_avx512vl(auVar63,auVar51);
      auVar57._0_4_ = (uint)(bVar7 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar63._0_4_;
      bVar8 = (bool)((byte)(uVar18 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar63._4_4_;
      bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar63._8_4_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar63._12_4_;
      bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
      auVar57._16_4_ = (uint)bVar8 * auVar35._16_4_ | (uint)!bVar8 * auVar63._16_4_;
      bVar8 = (bool)((byte)(uVar18 >> 5) & 1);
      auVar57._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * auVar63._20_4_;
      bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
      auVar57._24_4_ = (uint)bVar8 * auVar35._24_4_ | (uint)!bVar8 * auVar63._24_4_;
      bVar8 = SUB81(uVar18 >> 7,0);
      auVar57._28_4_ = (uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar63._28_4_;
      auVar35 = vminps_avx512vl(auVar47,auVar52);
      auVar51._0_4_ = (uint)(bVar7 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar47._0_4_;
      bVar8 = (bool)((byte)(uVar18 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar47._4_4_;
      bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar47._8_4_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar47._12_4_;
      bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
      auVar51._16_4_ = (uint)bVar8 * auVar35._16_4_ | (uint)!bVar8 * auVar47._16_4_;
      bVar8 = (bool)((byte)(uVar18 >> 5) & 1);
      auVar51._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * auVar47._20_4_;
      bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
      auVar51._24_4_ = (uint)bVar8 * auVar35._24_4_ | (uint)!bVar8 * auVar47._24_4_;
      bVar8 = SUB81(uVar18 >> 7,0);
      auVar51._28_4_ = (uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar47._28_4_;
      auVar35 = vmaxps_avx512vl(auVar34,auVar52);
      auVar47._0_4_ = (uint)(bVar7 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar34._0_4_;
      bVar8 = (bool)((byte)(uVar18 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar34._4_4_;
      bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar34._8_4_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar47._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar34._12_4_;
      bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
      auVar47._16_4_ = (uint)bVar8 * auVar35._16_4_ | (uint)!bVar8 * auVar34._16_4_;
      bVar8 = (bool)((byte)(uVar18 >> 5) & 1);
      auVar47._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * auVar34._20_4_;
      bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
      auVar47._24_4_ = (uint)bVar8 * auVar35._24_4_ | (uint)!bVar8 * auVar34._24_4_;
      bVar8 = SUB81(uVar18 >> 7,0);
      auVar47._28_4_ = (uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar34._28_4_;
      vandps_avx512vl(auVar49,auVar48);
      auVar34 = vmaxps_avx512vl(auVar61,auVar47);
      bVar8 = (bool)((byte)(uVar18 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar18 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar18 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar18 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar18 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar18 >> 6) & 1);
      bVar14 = SUB81(uVar18 >> 7,0);
      auVar62 = ZEXT3264(CONCAT428((uint)bVar14 * auVar34._28_4_ | (uint)!bVar14 * auVar62._28_4_,
                                   CONCAT424((uint)bVar13 * auVar34._24_4_ |
                                             (uint)!bVar13 * auVar62._24_4_,
                                             CONCAT420((uint)bVar12 * auVar34._20_4_ |
                                                       (uint)!bVar12 * auVar62._20_4_,
                                                       CONCAT416((uint)bVar11 * auVar34._16_4_ |
                                                                 (uint)!bVar11 * auVar62._16_4_,
                                                                 CONCAT412((uint)bVar10 *
                                                                           auVar34._12_4_ |
                                                                           (uint)!bVar10 *
                                                                           auVar62._12_4_,
                                                                           CONCAT48((uint)bVar9 *
                                                                                    auVar34._8_4_ |
                                                                                    (uint)!bVar9 *
                                                                                    auVar62._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar8 * auVar34._4_4_ |
                                                  (uint)!bVar8 * auVar62._4_4_,
                                                  (uint)(bVar7 & 1) * auVar34._0_4_ |
                                                  (uint)!(bool)(bVar7 & 1) * auVar62._0_4_))))))));
      auVar34 = auVar47;
      auVar35 = auVar56;
      auVar63 = auVar57;
      auVar47 = auVar51;
      auVar56 = auVar53;
      auVar57 = auVar50;
    }
    auVar55 = vshufps_avx512vl(auVar56,auVar56,0xb1);
    auVar56 = vminps_avx512vl(auVar56,auVar55);
    auVar55 = vshufpd_avx(auVar56,auVar56,5);
    auVar55 = vminps_avx(auVar56,auVar55);
    auVar59 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar55 = vshufps_avx512vl(auVar57,auVar57,0xb1);
    auVar57 = vminps_avx512vl(auVar57,auVar55);
    auVar55 = vshufpd_avx(auVar57,auVar57,5);
    auVar55 = vminps_avx(auVar57,auVar55);
    auVar28 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar28 = vunpcklps_avx(auVar59,auVar28);
    auVar55 = vshufps_avx512vl(auVar47,auVar47,0xb1);
    auVar57 = vminps_avx512vl(auVar47,auVar55);
    auVar55 = vshufpd_avx(auVar57,auVar57,5);
    auVar55 = vminps_avx(auVar57,auVar55);
    auVar59 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar59 = vinsertps_avx(auVar28,auVar59,0x28);
    auVar55 = vshufps_avx(auVar35,auVar35,0xb1);
    auVar55 = vmaxps_avx(auVar35,auVar55);
    auVar35 = vshufpd_avx(auVar55,auVar55,5);
    auVar55 = vmaxps_avx(auVar55,auVar35);
    auVar28 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar55 = vshufps_avx(auVar63,auVar63,0xb1);
    auVar55 = vmaxps_avx(auVar63,auVar55);
    auVar35 = vshufpd_avx(auVar55,auVar55,5);
    auVar55 = vmaxps_avx(auVar55,auVar35);
    auVar29 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar29 = vunpcklps_avx(auVar28,auVar29);
    auVar55 = vshufps_avx(auVar34,auVar34,0xb1);
    auVar55 = vmaxps_avx(auVar34,auVar55);
    auVar34 = vshufpd_avx(auVar55,auVar55,5);
    auVar55 = vmaxps_avx(auVar55,auVar34);
    auVar28 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar28 = vinsertps_avx(auVar29,auVar28,0x28);
    auVar55 = vshufps_avx(auVar61,auVar61,0xb1);
    auVar55 = vmaxps_avx(auVar61,auVar55);
    auVar34 = vshufpd_avx(auVar55,auVar55,5);
    auVar55 = vmaxps_avx(auVar55,auVar34);
    auVar29 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar29._4_4_ = auVar29._0_4_;
    auVar29._8_4_ = auVar29._0_4_;
    auVar29._12_4_ = auVar29._0_4_;
  }
  auVar32 = vminps_avx(auVar59,auVar58);
  auVar59 = vmaxps_avx(auVar28,auVar58);
  auVar58._4_4_ = fVar16;
  auVar58._0_4_ = fVar16;
  auVar58._8_4_ = fVar16;
  auVar58._12_4_ = fVar16;
  auVar28._8_4_ = 0x7fffffff;
  auVar28._0_8_ = 0x7fffffff7fffffff;
  auVar28._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(auVar58,auVar28);
  auVar28 = vmaxps_avx(auVar29,auVar28);
  auVar29 = vsubps_avx(auVar32,auVar28);
  auVar31._0_4_ = auVar59._0_4_ + auVar28._0_4_;
  auVar31._4_4_ = auVar59._4_4_ + auVar28._4_4_;
  auVar31._8_4_ = auVar59._8_4_ + auVar28._8_4_;
  auVar31._12_4_ = auVar59._12_4_ + auVar28._12_4_;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  auVar59 = vandps_avx(auVar29,auVar23);
  auVar28 = vandps_avx(auVar31,auVar23);
  auVar59 = vmaxps_avx(auVar59,auVar28);
  auVar28 = vmovshdup_avx(auVar59);
  auVar28 = vmaxss_avx(auVar28,auVar59);
  auVar59 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vmaxss_avx(auVar59,auVar28);
  fVar1 = auVar59._0_4_ * 4.7683716e-07;
  auVar59._4_4_ = fVar1;
  auVar59._0_4_ = fVar1;
  auVar59._8_4_ = fVar1;
  auVar59._12_4_ = fVar1;
  aVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar29,auVar59);
  (__return_storage_ptr__->lower).field_0 = aVar17;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar31._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar31._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar31._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar31._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }